

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
                   (char *fmt,ChainstateRole *args,unsigned_long *args_1,unsigned_long *args_2,
                   long *args_3,int *args_4,int *args_5,int *args_6)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  long *in_stack_fffffffffffffe18;
  string *args_1_00;
  ostringstream *this;
  char *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  ostringstream local_188 [152];
  int *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_188;
  args_1_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(ChainstateRole *)this,
             (unsigned_long *)args_1_00,(unsigned_long *)in_RDI,in_stack_fffffffffffffe18,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_1_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}